

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O1

result * __thiscall
baryonyx::itm::
solver_functor<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
::operator()(result *__return_storage_ptr__,
            solver_functor<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
            *this,vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                  *constraints,int variables,default_cost_type<double> *original_costs,
            double cost_constant)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  init_policy_type iVar4;
  context *ctx;
  context *ctx_00;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  rep rVar13;
  undefined8 extraout_RAX;
  long lVar14;
  result_status rVar15;
  ulong uVar16;
  random_engine *rng;
  int iVar17;
  bit_array_impl *x_optimistic;
  bit_array_impl *x_pessimistic;
  double *in_R9;
  long lVar18;
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar22 [16];
  double dVar21;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 extraout_var [56];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined8 in_XMM5_Qb;
  bit_array x;
  double ret;
  default_cost_type<double> norm_costs;
  compute_order compute;
  solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  slv;
  double local_190;
  bit_array_impl local_180;
  uint local_16c;
  double local_168;
  FILE *local_160;
  default_cost_type<double> *local_158;
  double local_150;
  ulong local_148;
  int local_13c;
  bit_array_impl local_138;
  double local_120;
  double local_118;
  double local_110;
  cost_type local_108;
  double local_f8;
  double local_f0;
  compute_order local_e8;
  solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  local_b0;
  undefined1 extraout_var_00 [56];
  
  auVar25 = ZEXT1664(ZEXT816(0));
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->variable_name).
    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = auVar25;
  *(undefined1 (*) [64])
   &(__return_storage_ptr__->affected_vars).values.
    super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
    _M_finish = auVar25;
  __return_storage_ptr__->strings = (string_buffer_ptr)auVar25._0_16_;
  (__return_storage_ptr__->method)._M_len = SUB168(auVar25._16_16_,0);
  (__return_storage_ptr__->method)._M_str = (char *)SUB168(auVar25._16_16_,8);
  (__return_storage_ptr__->affected_vars).names =
       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        )auVar25._32_24_;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)auVar25._56_8_;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  local_150 = cost_constant;
  bit_array_impl::bit_array_impl(&local_180,variables);
  ctx = this->m_ctx;
  normalize_costs<double,baryonyx::itm::default_cost_type<double>>
            ((itm *)&local_108,ctx,original_costs,this->m_rng,variables);
  local_118 = (ctx->parameters).kappa_step;
  local_110 = (ctx->parameters).kappa_max;
  local_120 = (ctx->parameters).alpha;
  local_160 = (FILE *)(ctx->parameters).theta;
  local_168 = (ctx->parameters).delta;
  if (local_168 < 0.0) {
    ctx_00 = this->m_ctx;
    local_b0.super_debug_logger<true>.ofs = local_160;
    info<>(ctx_00,"  - delta not defined, compute it:\n");
    if (variables == 0) {
      auVar19 = ZEXT816(0x7fefffffffffffff);
    }
    else {
      uVar16 = 0;
      auVar27._8_8_ = 0x7fffffffffffffff;
      auVar27._0_8_ = 0x7fffffffffffffff;
      auVar1 = ZEXT816(0x7fefffffffffffff);
      do {
        auVar31._8_8_ = 0;
        auVar31._0_8_ =
             *(double *)
              ((long)local_108.linear_elements._M_t.
                     super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                     super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                     super__Head_base<0UL,_double_*,_false>._M_head_impl + uVar16 * 8);
        auVar19 = vandpd_avx(auVar31,auVar27);
        uVar6 = vcmppd_avx512vl(auVar19,auVar1,1);
        uVar7 = vcmppd_avx512vl(auVar31,ZEXT816(0) << 0x40,4);
        bVar8 = (byte)uVar7 & 3 & (byte)uVar6 & 3;
        auVar19._0_8_ =
             (ulong)(bVar8 & 1) * auVar19._0_8_ + (ulong)!(bool)(bVar8 & 1) * auVar1._0_8_;
        auVar19._8_8_ = auVar1._8_8_;
        uVar16 = uVar16 + 1;
        auVar1 = auVar19;
      } while ((uint)variables != uVar16);
    }
    local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = auVar19._0_8_;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_b0.super_debug_logger<true>.ofs;
    auVar19 = vfnmadd132sd_fma(auVar19,auVar19,auVar1);
    local_138._0_8_ = auVar19._0_8_;
    info<double,double,double>
              ((baryonyx *)ctx_00,(context *)"    - delta={} (min normalized cost:{} / theta: {})\n"
               ,(char *)&local_138,(double *)&local_e8,(double *)&local_b0,in_R9);
    local_168 = (double)local_138._0_8_;
  }
  local_f0 = (ctx->parameters).pushing_k_factor;
  local_f8 = (ctx->parameters).pushing_objective_amplifier;
  local_148 = (ulong)(ctx->parameters).w;
  solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  ::solver_inequalities_01coeff
            (&local_b0,this->m_rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_108,constraints);
  compute_order::compute_order(&local_e8,(ctx->parameters).order,variables);
  dVar21 = (this->m_ctx->parameters).init_policy_random;
  local_138._0_8_ = 0.0;
  local_138.m_data._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long[]>,_true,_true>)
       (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0;
  iVar4 = (ctx->parameters).init_policy;
  if (iVar4 == bastert) {
    init_with_bastert<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>
              ((bit_array *)&local_180,original_costs,variables,0);
  }
  else {
    if (iVar4 == pessimistic_solve) {
      rng = this->m_rng;
      x_pessimistic = &local_180;
      x_optimistic = &local_138;
    }
    else {
      if (iVar4 != optimistic_solve) goto LAB_0039580d;
      rng = this->m_rng;
      x_pessimistic = &local_138;
      x_optimistic = &local_180;
    }
    init_with_pre_solve<baryonyx::itm::default_cost_type<double>,baryonyx::itm::maximize_tag>
              ((bit_array *)x_pessimistic,(bit_array *)x_optimistic,rng,original_costs,constraints,
               1.0);
  }
LAB_0039580d:
  local_158 = original_costs;
  if (local_180.m_size != 0) {
    iVar17 = 0;
    do {
      dVar20 = std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (this->m_rng);
      if (dVar20 < dVar21) {
        bit_array_impl::invert(&local_180,iVar17);
      }
      iVar17 = iVar17 + 1;
    } while (local_180.m_size != iVar17);
  }
  if (local_138.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)local_138.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  dVar21 = (ctx->parameters).kappa_min;
  rVar13 = std::chrono::_V2::steady_clock::now();
  (this->m_begin).__d.__r = rVar13;
  rVar13 = std::chrono::_V2::steady_clock::now();
  (this->m_end).__d.__r = rVar13;
  compute_order::
  init<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array>
            (&local_e8,&local_b0,(bit_array *)&local_180);
  auVar25 = ZEXT864((ulong)dVar21);
  local_13c = variables;
  if ((ctx->parameters).limit == 0) {
    uVar10 = 0;
  }
  else {
    iVar17 = 0x7fffffff;
    lVar18 = 0;
    local_16c = 0;
    do {
      auVar22._0_8_ = auVar25._0_8_;
      iVar9 = compute_order::
              run<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                        (&local_e8,&local_b0,(bit_array *)&local_180,this->m_rng,auVar22._0_8_,
                         local_168,(double)local_160);
      if (iVar9 == 0) {
        dVar21 = default_cost_type<double>::results(local_158,(bit_array *)&local_180,local_150);
        store_if_better(this,(bit_array *)&local_180,dVar21,lVar18);
        local_16c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        iVar17 = 0;
        bVar5 = false;
        local_190 = auVar22._0_8_;
LAB_0039596f:
        auVar25 = ZEXT864((ulong)local_190);
      }
      else {
        if (iVar9 < iVar17) {
          store_if_better(this,(bit_array *)&local_180,iVar9,lVar18);
          iVar17 = iVar9;
        }
        if ((long)local_148 < lVar18) {
          auVar25._0_8_ = pow((double)iVar9 / (double)local_b0.m,local_120);
          auVar25._8_56_ = extraout_var;
          auVar28._8_8_ = 0;
          auVar28._0_8_ = auVar22._0_8_;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = local_118;
          auVar22 = vfmadd231sd_fma(auVar28,auVar25._0_16_,auVar2);
        }
        else {
          auVar22._8_8_ = 0;
        }
        auVar25 = ZEXT1664(auVar22);
        rVar15 = kappa_max_reached;
        local_190 = auVar22._0_8_;
        if (local_110 < local_190) {
LAB_003959d1:
          __return_storage_ptr__->status = rVar15;
          bVar5 = false;
        }
        else {
          lVar14 = std::chrono::_V2::steady_clock::now();
          (this->m_end).__d.__r = lVar14;
          dVar21 = (this->m_ctx->parameters).time_limit;
          bVar5 = true;
          if (dVar21 <= 0.0) goto LAB_0039596f;
          rVar15 = time_limit_reached;
          auVar25 = ZEXT864((ulong)local_190);
          if (dVar21 < (double)(lVar14 - (this->m_begin).__d.__r) / 1000000000.0) goto LAB_003959d1;
        }
      }
      uVar10 = local_16c;
    } while ((bVar5) && (lVar18 = lVar18 + 1, lVar18 != (ctx->parameters).limit));
  }
  if ((uVar10 & 1) == 0) {
    __return_storage_ptr__->status = limit_reached;
  }
  else if (0 < (ctx->parameters).pushes_limit) {
    iVar17 = 0;
    iVar9 = 0;
    do {
      local_190 = auVar25._0_8_;
      iVar11 = compute_order::
               push_and_run<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                         (&local_e8,&local_b0,(bit_array *)&local_180,this->m_rng,
                          local_190 * local_f0,local_168,(double)local_160,local_f8);
      if (iVar11 == 0) {
        dVar21 = default_cost_type<double>::results(local_158,(bit_array *)&local_180,local_150);
        store_if_better(this,(bit_array *)&local_180,dVar21,
                        (long)~((ctx->parameters).pushing_iteration_limit * iVar9));
      }
      lVar18 = std::chrono::_V2::steady_clock::now();
      (this->m_end).__d.__r = lVar18;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = (this->m_ctx->parameters).time_limit;
      auVar23._0_8_ = (double)(lVar18 - (this->m_begin).__d.__r) / 1000000000.0;
      auVar23._8_8_ = in_XMM5_Qb;
      uVar6 = vcmppd_avx512vl(auVar29,ZEXT816(0),6);
      uVar16 = vcmppd_avx512vl(auVar29,auVar23,1);
      uVar16 = ((byte)uVar6 & 3) & uVar16;
      local_148 = CONCAT62(local_148._2_6_,(short)uVar16);
      if ((uVar16 & 1) == 0) {
        auVar25 = ZEXT864((ulong)local_190);
        if (0 < (ctx->parameters).pushing_iteration_limit) {
          iVar11 = 1;
          do {
            auVar24._0_8_ = auVar25._0_8_;
            iVar12 = compute_order::
                     run<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array,double>
                               (&local_e8,&local_b0,(bit_array *)&local_180,this->m_rng,
                                auVar24._0_8_,local_168,(double)local_160);
            if (iVar12 == 0) {
              dVar21 = default_cost_type<double>::results
                                 (local_158,(bit_array *)&local_180,local_150);
              store_if_better(this,(bit_array *)&local_180,dVar21,
                              (long)((ctx->parameters).pushing_iteration_limit * iVar17 - iVar11));
              auVar25 = ZEXT864((ulong)auVar24._0_8_);
              break;
            }
            if ((double)(iVar11 + -1) <= (ctx->parameters).w) {
              auVar24._8_8_ = 0;
            }
            else {
              auVar26._0_8_ = pow((double)iVar12 / (double)local_b0.m,local_120);
              auVar26._8_56_ = extraout_var_00;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = auVar24._0_8_;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = local_118;
              auVar24 = vfmadd231sd_fma(auVar30,auVar26._0_16_,auVar3);
            }
            auVar25 = ZEXT1664(auVar24);
            local_190 = auVar24._0_8_;
            if (local_110 < local_190) break;
            lVar18 = std::chrono::_V2::steady_clock::now();
            (this->m_end).__d.__r = lVar18;
            dVar21 = (this->m_ctx->parameters).time_limit;
            if ((0.0 < dVar21) &&
               (dVar21 < (double)(lVar18 - (this->m_begin).__d.__r) / 1000000000.0))
            goto LAB_00395ad0;
            auVar25 = ZEXT864((ulong)local_190);
            bVar5 = iVar11 < (ctx->parameters).pushing_iteration_limit;
            iVar11 = iVar11 + 1;
          } while (bVar5);
        }
      }
      else {
LAB_00395ad0:
        auVar25 = ZEXT864((ulong)local_190);
      }
      if ((local_148 & 1) != 0) break;
      iVar9 = iVar9 + 1;
      iVar17 = iVar17 + -1;
    } while (iVar9 < (ctx->parameters).pushes_limit);
  }
  iVar17 = local_13c;
  if ((this->m_best).remaining_constraints == 0) {
    __return_storage_ptr__->status = success;
  }
  if ((this->m_best).x.super_bit_array_impl.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl != (unsigned_long *)0x0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    convert<baryonyx::itm::maximize_tag>
              (&this->m_best,
               (__return_storage_ptr__->solutions).
               super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
               super__Vector_impl_data._M_start,iVar17);
  }
  if (local_e8.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
  ::~solver_inequalities_01coeff(&local_b0);
  if ((__uniq_ptr_impl<double,_std::default_delete<double[]>_>)
      local_108.linear_elements._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
      _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_108.linear_elements._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  if ((tuple<unsigned_long_*,_std::default_delete<unsigned_long[]>_>)
      local_180.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (_Head_base<0UL,_unsigned_long_*,_false>)0x0) {
    operator_delete__((void *)local_180.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator()(const std::vector<merged_constraint>& constraints,
                      int variables,
                      const Cost& original_costs,
                      double cost_constant)
    {
        result r;

        bit_array x(variables);

        int best_remaining = INT_MAX;

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const long int w_limit = static_cast<long int>(p.w);

        Solver slv(
          m_rng, length(constraints), variables, norm_costs, constraints);

        compute_order compute(p.order, variables);

        {
            std::bernoulli_distribution choose_mutation(
              m_ctx.parameters.init_policy_random);
            bit_array empty_x;

            switch (p.init_policy) {
            case solver_parameters::init_policy_type::pessimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  x, empty_x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::optimistic_solve:
                init_with_pre_solve<Cost, Mode>(
                  empty_x, x, m_rng, original_costs, constraints, 1.0);
                break;

            case solver_parameters::init_policy_type::bastert:
                init_with_bastert<Cost, Mode>(x, original_costs, variables, 0);
                break;
            }

            for (int i = 0, e = x.size(); i != e; ++i)
                if (choose_mutation(m_rng))
                    x.invert(i);
        }

        bool start_push = false;
        auto kappa = static_cast<Float>(p.kappa_min);

        Observer obs("img", slv.m, slv.n, p.limit);

        m_begin = std::chrono::steady_clock::now();
        m_end = std::chrono::steady_clock::now();

        compute.init(slv, x);

        for (long int i = 0; i != p.limit; ++i) {
            auto remaining = compute.run(slv, x, m_rng, kappa, delta, theta);
            obs.make_observation(slv.ap, slv.P.get(), slv.pi.get());

            if (remaining == 0) {
                store_if_better(
                  x, original_costs.results(x, cost_constant), i);
                best_remaining = remaining;
                start_push = true;
                break;
            }

            if (remaining < best_remaining) {
                store_if_better(x, remaining, i);
                best_remaining = remaining;
            }

            if (i > w_limit)
                kappa += kappa_step * std::pow(static_cast<Float>(remaining) /
                                                 static_cast<Float>(slv.m),
                                               alpha);

            if (kappa > kappa_max) {
                r.status = result_status::kappa_max_reached;
                break;
            }

            if (is_timelimit_reached()) {
                r.status = result_status::time_limit_reached;
                break;
            }
        }

        if (!start_push) {
            r.status = result_status::limit_reached;
        } else {
            for (int push = 0; push < p.pushes_limit; ++push) {
                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_rng,
                                       pushing_k_factor * kappa,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0)
                    store_if_better(x,
                                    original_costs.results(x, cost_constant),
                                    -push * p.pushing_iteration_limit - 1);

                if (is_timelimit_reached())
                    break;

                for (int iter = 0; iter < p.pushing_iteration_limit; ++iter) {
                    remaining =
                      compute.run(slv, x, m_rng, kappa, delta, theta);

                    if (remaining == 0) {
                        store_if_better(
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;

                    if (is_timelimit_reached())
                        break;
                }
            }
        }

        if (m_best.remaining_constraints == 0)
            r.status = result_status::success;

        if (!m_best.x.empty()) {
            r.solutions.resize(1);
            convert(m_best, r.solutions[0], variables);
        }

        return r;
    }